

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_random.cpp
# Opt level: O1

Reals __thiscall
Omega_h::unit_uniform_random_reals_from_globals(Omega_h *this,GOs *globals,I64 seed,I64 counter)

{
  int *piVar1;
  Alloc *pAVar2;
  ulong uVar3;
  int iVar4;
  _Alloc_hider _Var5;
  ulong **__dest;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong *puVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  long lVar19;
  int size_in;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  Reals RVar26;
  ScopedTimer omega_h_scoped_function_timer;
  type functor;
  Write<double> out;
  size_type __dnew;
  ScopedTimer local_141;
  string local_140;
  Alloc *local_120;
  void *local_118;
  Write<double> local_110;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  Alloc *local_c0;
  Alloc *local_b8;
  ulong local_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  Write<double> local_88;
  Alloc *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong **local_50;
  ulong *local_48;
  ulong *local_40 [2];
  
  pAVar2 = (globals->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar20 = pAVar2->size;
  }
  else {
    sVar20 = (ulong)pAVar2 >> 3;
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_b8 = (Alloc *)this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"");
  size_in = (int)(sVar20 >> 3);
  Write<double>::Write(&local_110,size_in,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)(globals->write_).shared_alloc_.alloc;
  if (((ulong)local_140._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_140._M_dataplus._M_p != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_140._M_dataplus._M_p = (pointer)(((Alloc *)local_140._M_dataplus._M_p)->size * 8 + 1);
    }
    else {
      ((Alloc *)local_140._M_dataplus._M_p)->use_count =
           ((Alloc *)local_140._M_dataplus._M_p)->use_count + 1;
    }
  }
  local_140._M_string_length = (size_type)(globals->write_).shared_alloc_.direct_ptr;
  local_120 = local_110.shared_alloc_.alloc;
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_120 = (Alloc *)((local_110.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_110.shared_alloc_.alloc)->use_count = (local_110.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_118 = local_110.shared_alloc_.direct_ptr;
  local_100 = (ulong *)0x5d;
  local_140.field_2._M_allocated_capacity = seed;
  local_140.field_2._8_8_ = counter;
  local_50 = local_40;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_100);
  puVar9 = local_100;
  local_40[0] = local_100;
  local_50 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_48 = puVar9;
  *(undefined1 *)((long)__dest + (long)puVar9) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_98 = *puVar9;
    lStack_90 = plVar6[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar9;
    local_a8 = (ulong *)*plVar6;
  }
  local_a0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,'\x02');
  *(undefined2 *)local_100 = 0x3438;
  uVar8 = 0xf;
  if (local_a8 != &local_98) {
    uVar8 = local_98;
  }
  if (uVar8 < (ulong)(local_f8 + local_a0)) {
    uVar8 = 0xf;
    if (local_100 != local_f0) {
      uVar8 = local_f0[0];
    }
    if ((ulong)(local_f8 + local_a0) <= uVar8) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00444c23;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_100);
LAB_00444c23:
  local_e0 = &local_d0;
  plVar6 = puVar7 + 2;
  if ((long *)*puVar7 == plVar6) {
    local_d0 = *plVar6;
    uStack_c8 = puVar7[3];
  }
  else {
    local_d0 = *plVar6;
    local_e0 = (long *)*puVar7;
  }
  local_d8 = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)plVar6 = 0;
  begin_code("parallel_for",(char *)local_e0);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(long)local_40[0] + 1);
  }
  if (0 < size_in) {
    local_78 = (Alloc *)local_140._M_dataplus._M_p;
    if (((ulong)local_140._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_140._M_dataplus._M_p != (Alloc *)0x0) {
      local_78 = (Alloc *)(*(long *)local_140._M_dataplus._M_p * 8 + 1);
    }
    local_b0 = local_140.field_2._M_allocated_capacity;
    if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
      local_c0 = (Alloc *)(local_120->size * 8 + 1);
    }
    else {
      local_c0 = local_120;
    }
    pAVar2 = local_c0;
    entering_parallel = '\0';
    uVar8 = ((ulong)local_140.field_2._8_8_ >> 1 & 0xffffffff) * 0xd2511f53;
    uVar22 = (local_140.field_2._M_allocated_capacity & 0xffffffff) * 0xcd9e8d57;
    local_60 = uVar22 >> 0x20;
    local_68 = uVar8 & 0xffffffff;
    local_70 = local_140.field_2._8_8_ & 0xfffffffffffffffe;
    local_58 = (ulong)local_140.field_2._8_8_ >> 0x21 ^ local_60;
    lVar19 = 0;
    do {
      uVar3 = *(ulong *)(local_140._M_string_length + lVar19 * 8);
      dVar23 = 0.0;
      uVar21 = (uint)uVar22;
      iVar4 = (int)uVar3;
      uVar18 = local_140.field_2._8_8_;
      if ((local_140.field_2._8_8_ & 1) != 0) {
        uVar15 = (uVar3 & 0xffffffff ^ local_58) * 0xd2511f53;
        lVar11 = ((uVar8 ^ local_140.field_2._M_allocated_capacity ^ uVar3) >> 0x20) * 0xcd9e8d57;
        lVar14 = ((uVar3 + 0xbb67ae8500000000 ^ uVar15) >> 0x20 ^ local_68) * 0xcd9e8d57;
        uVar12 = (ulong)(uVar21 ^ iVar4 + 0x9e3779b9U ^ (uint)((ulong)lVar11 >> 0x20)) * 0xd2511f53;
        lVar16 = (uVar15 & 0xffffffff ^ (uVar3 + 0x76cf5d0a00000000 ^ uVar12) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)((uint)lVar11 ^ iVar4 + 0x3c6ef372U ^ (uint)((ulong)lVar14 >> 0x20)) *
                 0xd2511f53;
        lVar13 = (uVar12 & 0xffffffff ^ (uVar3 + 0x32370b8f00000000 ^ uVar15) >> 0x20) * 0xcd9e8d57;
        uVar12 = (ulong)((uint)lVar14 ^ iVar4 + 0xdaa66d2bU ^ (uint)((ulong)lVar16 >> 0x20)) *
                 0xd2511f53;
        lVar11 = (uVar15 & 0xffffffff ^ (uVar3 + 0xed9eba1400000000 ^ uVar12) >> 0x20) * 0xcd9e8d57;
        uVar17 = (ulong)((uint)lVar16 ^ iVar4 + 0x78dde6e4U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        lVar14 = (uVar12 & 0xffffffff ^ (uVar3 + 0xa906689900000000 ^ uVar17) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)((uint)lVar13 ^ iVar4 + 0x1715609dU ^ (uint)((ulong)lVar11 >> 0x20)) *
                 0xd2511f53;
        lVar13 = (uVar17 & 0xffffffff ^ (uVar3 + 0x646e171e00000000 ^ uVar15) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)((uint)lVar13 ^ iVar4 + 0xf1bbcdc8U ^
                        (uint)((uVar15 & 0xffffffff ^
                               ((ulong)((uint)lVar11 ^ iVar4 + 0xb54cda56U ^
                                       (uint)((ulong)lVar14 >> 0x20)) * 0xd2511f53 ^
                               uVar3 + 0x1fd5c5a300000000) >> 0x20) * 0xcd9e8d57 >> 0x20));
        lVar11 = uVar15 * -0x2daee0ad00000000;
        auVar24._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar24._0_8_ = lVar11;
        auVar24._12_4_ = 0x45300000;
        dVar23 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   (uint)(uVar15 * 0xd2511f53 >> 0x20) ^
                                   (uint)(uVar3 + 0x96a522ad00000000 >> 0x20) ^
                                   ((uint)lVar14 ^ iVar4 + 0x5384540fU ^
                                   (uint)((ulong)lVar13 >> 0x20)) * -0x2daee0ad) -
                 4503599627370496.0)) * 5.421010862427522e-20;
        uVar18 = local_70;
      }
      if ((uVar18 & 1) == 0) {
        uVar15 = ((ulong)uVar18 >> 1 & 0xffffffff) * 0xd2511f53;
        lVar11 = ((uVar3 ^ local_140.field_2._M_allocated_capacity ^ uVar15) >> 0x20) * 0xcd9e8d57;
        uVar12 = ((ulong)uVar18 >> 0x21 ^ local_60 ^ uVar3 & 0xffffffff) * 0xd2511f53;
        lVar13 = (uVar15 & 0xffffffff ^ (uVar3 + 0xbb67ae8500000000 ^ uVar12) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)(uVar21 ^ iVar4 + 0x9e3779b9U ^ (uint)((ulong)lVar11 >> 0x20)) * 0xd2511f53;
        lVar16 = (uVar12 & 0xffffffff ^ (uVar3 + 0x76cf5d0a00000000 ^ uVar15) >> 0x20) * 0xcd9e8d57;
        uVar12 = (ulong)((uint)lVar11 ^ iVar4 + 0x3c6ef372U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        lVar11 = (uVar15 & 0xffffffff ^ (uVar3 + 0x32370b8f00000000 ^ uVar12) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)((uint)lVar13 ^ iVar4 + 0xdaa66d2bU ^ (uint)((ulong)lVar16 >> 0x20)) *
                 0xd2511f53;
        lVar14 = (uVar12 & 0xffffffff ^ (uVar3 + 0xed9eba1400000000 ^ uVar15) >> 0x20) * 0xcd9e8d57;
        uVar17 = (ulong)((uint)lVar16 ^ iVar4 + 0x78dde6e4U ^ (uint)((ulong)lVar11 >> 0x20)) *
                 0xd2511f53;
        lVar13 = (uVar15 & 0xffffffff ^ (uVar3 + 0xa906689900000000 ^ uVar17) >> 0x20) * 0xcd9e8d57;
        uVar15 = (ulong)((uint)lVar11 ^ iVar4 + 0x1715609dU ^ (uint)((ulong)lVar14 >> 0x20)) *
                 0xd2511f53;
        uVar12 = (ulong)((uint)lVar14 ^ iVar4 + 0xb54cda56U ^ (uint)((ulong)lVar13 >> 0x20)) *
                 0xd2511f53;
        uVar17 = uVar12 & 0xffffffff ^
                 ((ulong)((uint)lVar13 ^ iVar4 + 0x5384540fU ^
                         (uint)((uVar17 & 0xffffffff ^ (uVar3 + 0x646e171e00000000 ^ uVar15) >> 0x20
                                ) * 0xcd9e8d57 >> 0x20)) * 0xd2511f53 ^ uVar3 + 0xdb3d742800000000)
                 >> 0x20;
        lVar11 = uVar17 * -0x326172a900000000;
        auVar25._8_4_ = (int)((ulong)lVar11 >> 0x20);
        auVar25._0_8_ = lVar11;
        auVar25._12_4_ = 0x45300000;
        dVar23 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   iVar4 + 0x8ff34781U ^
                                   ((uint)(uVar3 + 0x1fd5c5a300000000 >> 0x20) ^
                                    (uint)(uVar12 >> 0x20) ^ (uint)uVar15) * -0x326172a9 ^
                                   (uint)(uVar17 * 0xcd9e8d57 >> 0x20)) - 4503599627370496.0)) *
                 5.421010862427522e-20;
      }
      *(double *)((long)local_118 + lVar19 * 8) = dVar23;
      lVar19 = lVar19 + 1;
    } while (size_in != (int)lVar19);
    if (((ulong)local_c0 & 7) == 0 && local_c0 != (Alloc *)0x0) {
      piVar1 = &local_c0->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c0);
        operator_delete(pAVar2,0x48);
      }
    }
    pAVar2 = local_78;
    if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
      piVar1 = &local_78->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78);
        operator_delete(pAVar2,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer(&local_141);
  local_88.shared_alloc_.alloc = local_110.shared_alloc_.alloc;
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.shared_alloc_.alloc = (Alloc *)((local_110.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_110.shared_alloc_.alloc)->use_count = (local_110.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.shared_alloc_.direct_ptr = local_110.shared_alloc_.direct_ptr;
  Read<double>::Read((Read<signed_char> *)local_b8,&local_88);
  pAVar2 = local_88.shared_alloc_.alloc;
  pvVar10 = extraout_RDX;
  if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 && local_88.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
      pvVar10 = extraout_RDX_00;
    }
  }
  pAVar2 = local_120;
  if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
    piVar1 = &local_120->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_120);
      operator_delete(pAVar2,0x48);
      pvVar10 = extraout_RDX_01;
    }
  }
  _Var5._M_p = local_140._M_dataplus._M_p;
  if (((ulong)local_140._M_dataplus._M_p & 7) == 0 &&
      (Alloc *)local_140._M_dataplus._M_p != (Alloc *)0x0) {
    piVar1 = (int *)(local_140._M_dataplus._M_p + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_140._M_dataplus._M_p);
      operator_delete(_Var5._M_p,0x48);
      pvVar10 = extraout_RDX_02;
    }
  }
  if (((ulong)local_110.shared_alloc_.alloc & 7) == 0 &&
      local_110.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_110.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_110.shared_alloc_.alloc);
      operator_delete(local_110.shared_alloc_.alloc,0x48);
      pvVar10 = extraout_RDX_03;
    }
  }
  RVar26.write_.shared_alloc_.direct_ptr = pvVar10;
  RVar26.write_.shared_alloc_.alloc = local_b8;
  return (Reals)RVar26.write_.shared_alloc_;
}

Assistant:

Reals unit_uniform_random_reals_from_globals(
    GOs const globals, I64 const seed, I64 const counter) {
  auto const n = globals.size();
  auto const out = Write<Real>(n);
  auto functor = OMEGA_H_LAMBDA(LO const i) {
    auto const global = globals[i];
    UnitUniformDistribution distrib(seed, global, counter);
    out[i] = distrib();
  };
  parallel_for(n, std::move(functor));
  return out;
}